

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_pair_checker.cpp
# Opt level: O0

SymbolPairChecker * __thiscall
my_algorithm::SymbolPairChecker::operator=(SymbolPairChecker *this,SymbolPairChecker *checker)

{
  Stack<char> local_40;
  SymbolPairChecker *local_18;
  SymbolPairChecker *checker_local;
  SymbolPairChecker *this_local;
  
  this->_cursor = checker->_cursor;
  local_18 = checker;
  checker_local = this;
  std::__cxx11::string::operator=((string *)&this->_open_symbols,(string *)&checker->_open_symbols);
  std::__cxx11::string::operator=
            ((string *)&this->_close_symbols,(string *)&local_18->_close_symbols);
  data_structures::Stack<char>::Stack(&local_40);
  data_structures::Stack<char>::operator=(&this->_stack,&local_40);
  data_structures::Stack<char>::~Stack(&local_40);
  return this;
}

Assistant:

SymbolPairChecker& SymbolPairChecker::operator=(const SymbolPairChecker &checker) {
        _cursor = checker._cursor;
        _open_symbols = checker._open_symbols;
        _close_symbols = checker._close_symbols;
        _stack = data_structures::Stack<char>();
        return *this;
    }